

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ServerLib.cpp
# Opt level: O0

void __thiscall ServerLib::ServerLib(ServerLib *this,int port)

{
  anon_class_8_1_8991fb9c local_30 [3];
  int local_14;
  ServerLib *pSStack_10;
  int port_local;
  ServerLib *this_local;
  
  this->port = port;
  this->server_fd = 0;
  this->opt = 1;
  this->addrlen = 0x10;
  this->debugFlag = false;
  local_14 = port;
  pSStack_10 = this;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->url_options);
  WebBinder::WebBinder(&this->webBinder);
  std::function<int_(int)>::function(&this->thread_action);
  local_30[0].this = this;
  std::function<int(int)>::operator=((function<int(int)> *)&this->thread_action,local_30);
  return;
}

Assistant:

ServerLib::ServerLib(int port) : port(port) {
  // Temporary
  thread_action = [this](int socket) {
      char buffer[BUFFERSIZE] = {0};
      std::cout << "Client Connected" << std::endl;
        
      read(socket, buffer, BUFFERSIZE);
      
      Header header = ParseHeader(buffer);
      
      //std::cout << header.getHTTP() << std::endl;
      
      //std::cout << header.getHeaderline("upgrade") << std::endl;
      
      if (header.getHeaderline("upgrade").compare("h2c") == 0) {
          //Upgrade connection to HTTP2(h2c)
          HTTP2Connection connection(socket, buffer, &webBinder);
      } else {
          //Respond as HTTP 1.1
          stringstream responseStream, bodyStream;
          if (header.getHeaderline(":path").back() == '/') header.setHeaderline(":path", header.getHeaderline(":path") + "index.html");
          std::string path = webBinder.getPath(header.getHeaderline(":path"));
          
          int fSize = ((true) ? read_htmlfile(bodyStream, path) : -1);
          
          if (fSize >= 0) {
              responseStream << "HTTP/1.1 200 OK\r\nContent-length: " << fSize << "\r\n";
              responseStream << "Content-Type: text/html\r\n\r\n";
          } else {
              responseStream << "HTTP/1.1 404 Not Found";
          }
          
          responseStream << bodyStream.rdbuf();
          std::string response = responseStream.str();
          write(socket, response.c_str(), response.length());
          std::cout << "Response sent" << std::endl;
          
          close(socket);
      }
      return 0;
  };
}